

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cctest.h
# Opt level: O0

void CheckEqualsHelper(char *file,int line,char *expected_source,char *expected,char *value_source,
                      char *value)

{
  int iVar1;
  char *in_RCX;
  undefined8 in_RDX;
  uint in_ESI;
  undefined8 in_RDI;
  undefined8 in_R8;
  char *in_R9;
  
  if (((in_RCX != (char *)0x0) || (in_R9 == (char *)0x0)) &&
     ((in_RCX == (char *)0x0 || (in_R9 != (char *)0x0)))) {
    if ((in_RCX != (char *)0x0) && (in_R9 != (char *)0x0)) {
      iVar1 = strcmp(in_RCX,in_R9);
      if (iVar1 != 0) {
        printf("%s:%d:\n CHECK_EQ(%s, %s) failed\n#  Expected: %s\n#  Found:    %s\n",in_RDI,
               (ulong)in_ESI,in_RDX,in_R8,in_RCX,in_R9);
        abort();
      }
    }
    return;
  }
  abort();
}

Assistant:

static inline void CheckEqualsHelper(const char* file, int line,
                                     const char* expected_source,
                                     const char* expected,
                                     const char* value_source,
                                     const char* value) {
  if ((expected == NULL && value != NULL) ||
      (expected != NULL && value == NULL)) {
    abort();
  }

  if ((expected != NULL && value != NULL && strcmp(expected, value) != 0)) {
    printf("%s:%d:\n CHECK_EQ(%s, %s) failed\n"
           "#  Expected: %s\n"
           "#  Found:    %s\n",
           file, line, expected_source, value_source, expected, value);
    abort();
  }
}